

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,size_t rows,size_t cols,
          VectorDynSize *memoryReserveDescription)

{
  double *vector;
  size_t vectorSize;
  
  VectorDynSize::VectorDynSize(&this->m_values);
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_allocatedSize = 0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_rows = rows;
  this->m_columns = cols;
  vector = VectorDynSize::data(memoryReserveDescription);
  vectorSize = VectorDynSize::size(memoryReserveDescription);
  initializeMatrix(this,cols,vector,vectorSize);
  return;
}

Assistant:

SparseMatrix<iDynTree::ColumnMajor>::SparseMatrix(std::size_t rows, std::size_t cols, const iDynTree::VectorDynSize& memoryReserveDescription)
    : m_allocatedSize(0)
    , m_rows(rows)
    , m_columns(cols)
    {
        initializeMatrix(cols, memoryReserveDescription.data(), memoryReserveDescription.size());
    }